

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O3

void __thiscall cppforth::Forth::writeChar(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  long *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  long *local_48 [2];
  long local_38 [2];
  
  requireDStackDepth(this,2,"WRITE-CHAR");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"WRITE-CHAR","");
  GetFileHandle((Forth *)&local_58,(Cell)this,(string *)(ulong)uVar1,(errorCodes)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  ForthStack<unsigned_int>::getTop(this_00);
  std::ios::clear((int)local_58 + (int)*(undefined8 *)(*local_58 + -0x18));
  std::ostream::put((char)local_58 + '\x10');
  ForthStack<unsigned_int>::setTop
            (this_00,-(*(uint *)((long)local_58 + *(long *)(*local_58 + -0x18) + 0x20) & 1) &
                     0xffffffb5);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void writeChar() {
	REQUIRE_DSTACK_DEPTH(2, "WRITE-CHAR");
	auto h = (dStack.getTop()); pop();
	auto f = GetFileHandle(h, "WRITE-CHAR", errorWriteFile);
	auto ch = static_cast<char>(dStack.getTop());
	f->clear();
	f->put(ch);
	auto status = f->rdstate();
	dStack.setTop(f->bad() ? Cell(errorWriteFile) : 0);
}